

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DataTypeClamp(ImGuiDataType data_type,void *p_data,void *p_min,void *p_max)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  
  switch(data_type) {
  case 0:
    bVar1 = *p_min;
    if (((char)bVar1 <= *p_data) && (bVar1 = *p_max, *p_data <= (char)bVar1)) {
      return false;
    }
    break;
  case 1:
    bVar1 = *p_min;
    if ((bVar1 <= *p_data) && (bVar1 = *p_max, *p_data <= bVar1)) {
      return false;
    }
    break;
  case 2:
    uVar2 = *p_min;
    if (((short)uVar2 <= *p_data) && (uVar2 = *p_max, *p_data <= (short)uVar2)) {
      return false;
    }
    goto LAB_00182f0d;
  case 3:
    uVar2 = *p_min;
    if ((uVar2 <= *p_data) && (uVar2 = *p_max, *p_data <= uVar2)) {
      return false;
    }
LAB_00182f0d:
    *(ushort *)p_data = uVar2;
    return true;
  case 4:
    uVar3 = *p_min;
    if (((int)uVar3 <= *p_data) && (uVar3 = *p_max, *p_data <= (int)uVar3)) {
      return false;
    }
    goto LAB_00182f47;
  case 5:
    uVar3 = *p_min;
    if ((uVar3 <= *p_data) && (uVar3 = *p_max, *p_data <= uVar3)) {
      return false;
    }
LAB_00182f47:
    *(uint *)p_data = uVar3;
    return true;
  case 6:
    uVar4 = *p_min;
    if (((long)uVar4 <= *p_data) && (uVar4 = *p_max, *p_data <= (long)uVar4)) {
      return false;
    }
    goto LAB_00182f5e;
  case 7:
    uVar4 = *p_min;
    if ((uVar4 <= *p_data) && (uVar4 = *p_max, *p_data <= uVar4)) {
      return false;
    }
LAB_00182f5e:
    *(ulong *)p_data = uVar4;
    return true;
  case 8:
    fVar5 = *p_min;
    if ((fVar5 <= *p_data) && (fVar5 = *p_max, *p_data <= fVar5)) {
      return false;
    }
    *(float *)p_data = fVar5;
    return true;
  case 9:
    dVar6 = *p_min;
    if ((dVar6 <= *p_data) && (dVar6 = *p_max, *p_data <= dVar6)) {
      return false;
    }
    *(double *)p_data = dVar6;
    return true;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x785,
                  "bool ImGui::DataTypeClamp(ImGuiDataType, void *, const void *, const void *)");
  }
  *(byte *)p_data = bVar1;
  return true;
}

Assistant:

bool ImGui::DataTypeClamp(ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return ClampBehaviorT<ImS8  >((ImS8*  )p_data, *(const ImS8*  )p_min, *(const ImS8*  )p_max);
    case ImGuiDataType_U8:     return ClampBehaviorT<ImU8  >((ImU8*  )p_data, *(const ImU8*  )p_min, *(const ImU8*  )p_max);
    case ImGuiDataType_S16:    return ClampBehaviorT<ImS16 >((ImS16* )p_data, *(const ImS16* )p_min, *(const ImS16* )p_max);
    case ImGuiDataType_U16:    return ClampBehaviorT<ImU16 >((ImU16* )p_data, *(const ImU16* )p_min, *(const ImU16* )p_max);
    case ImGuiDataType_S32:    return ClampBehaviorT<ImS32 >((ImS32* )p_data, *(const ImS32* )p_min, *(const ImS32* )p_max);
    case ImGuiDataType_U32:    return ClampBehaviorT<ImU32 >((ImU32* )p_data, *(const ImU32* )p_min, *(const ImU32* )p_max);
    case ImGuiDataType_S64:    return ClampBehaviorT<ImS64 >((ImS64* )p_data, *(const ImS64* )p_min, *(const ImS64* )p_max);
    case ImGuiDataType_U64:    return ClampBehaviorT<ImU64 >((ImU64* )p_data, *(const ImU64* )p_min, *(const ImU64* )p_max);
    case ImGuiDataType_Float:  return ClampBehaviorT<float >((float* )p_data, *(const float* )p_min, *(const float* )p_max);
    case ImGuiDataType_Double: return ClampBehaviorT<double>((double*)p_data, *(const double*)p_min, *(const double*)p_max);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}